

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.h
# Opt level: O2

Element __thiscall Galois::Element::operator*(Element *this,Element *rhs)

{
  Field *gf;
  long in_RDX;
  undefined8 extraout_RDX;
  Element EVar1;
  
  gf = rhs->m_gf;
  Element(this,gf,(gf->times).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(long)(gf->times).m_sizeX * (long)*(int *)(in_RDX + 8) + (long)rhs->m_value]);
  EVar1._8_8_ = extraout_RDX;
  EVar1.m_gf = (Field *)this;
  return EVar1;
}

Assistant:

Element operator*(const Element& rhs) const
    {
#ifdef GF_SIZE_DEBUG
        if (m_gf->q != rhs.m_gf->q)
            throw std::runtime_error("incompatible fields");
#endif
#ifdef GF_RANGE_DEBUG
        return Element(m_gf, m_gf->times.at(m_value, rhs.m_value));
#else
        return Element(m_gf, m_gf->times(m_value, rhs.m_value));
#endif
    }